

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

void Diligent::GLSLangUtils::anon_unknown_4::LogCompilerError
               (char *DebugOutputMessage,char *InfoLog,char *InfoDebugLog,char *ShaderSource,
               size_t SourceCodeLen,IDataBlob **ppCompilerOutput)

{
  undefined *puVar1;
  undefined8 uVar2;
  long lVar3;
  DataBlobImpl *pDVar4;
  char *__dest;
  void *__src;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1;
  char *DataPtr;
  RefCntAutoPtr<Diligent::DataBlobImpl> pOutputDataBlob;
  string _msg;
  allocator<char> local_59;
  string local_58 [8];
  string ErrorLog;
  IDataBlob **ppCompilerOutput_local;
  size_t SourceCodeLen_local;
  char *ShaderSource_local;
  char *InfoDebugLog_local;
  char *InfoLog_local;
  char *DebugOutputMessage_local;
  
  Args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ShaderSource;
  ErrorLog.field_2._8_8_ = ppCompilerOutput;
  InfoLog_local = DebugOutputMessage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,InfoLog,&local_59);
  std::allocator<char>::~allocator(&local_59);
  if (*InfoDebugLog != '\0') {
    std::__cxx11::string::push_back((char)local_58);
    std::__cxx11::string::append((char *)local_58);
  }
  FormatString<char_const*,std::__cxx11::string>
            ((string *)&pOutputDataBlob,(Diligent *)&InfoLog_local,(char **)local_58,Args_1);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(2,uVar2,0);
  }
  std::__cxx11::string::~string((string *)&pOutputDataBlob);
  if (ErrorLog.field_2._8_8_ != 0) {
    lVar3 = std::__cxx11::string::length();
    DataBlobImpl::Create((DataBlobImpl *)&DataPtr,SourceCodeLen + 2 + lVar3,(void *)0x0);
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&DataPtr);
    __dest = DataBlobImpl::GetDataPtr<char>(pDVar4,0);
    __src = (void *)std::__cxx11::string::data();
    lVar3 = std::__cxx11::string::length();
    memcpy(__dest,__src,lVar3 + 1);
    lVar3 = std::__cxx11::string::length();
    memcpy(__dest + lVar3 + 1,ShaderSource,SourceCodeLen + 1);
    pDVar4 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&DataPtr);
    DataBlobImpl::QueryInterface
              (pDVar4,(INTERFACE_ID *)IID_DataBlob,(IObject **)ErrorLog.field_2._8_8_);
    RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&DataPtr);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void LogCompilerError(const char* DebugOutputMessage,
                      const char* InfoLog,
                      const char* InfoDebugLog,
                      const char* ShaderSource,
                      size_t      SourceCodeLen,
                      IDataBlob** ppCompilerOutput)
{
    std::string ErrorLog(InfoLog);
    if (*InfoDebugLog != '\0')
    {
        ErrorLog.push_back('\n');
        ErrorLog.append(InfoDebugLog);
    }
    LOG_ERROR_MESSAGE(DebugOutputMessage, ErrorLog);

    if (ppCompilerOutput != nullptr)
    {
        auto  pOutputDataBlob = DataBlobImpl::Create(SourceCodeLen + 1 + ErrorLog.length() + 1);
        char* DataPtr         = pOutputDataBlob->GetDataPtr<char>();
        memcpy(DataPtr, ErrorLog.data(), ErrorLog.length() + 1);
        memcpy(DataPtr + ErrorLog.length() + 1, ShaderSource, SourceCodeLen + 1);
        pOutputDataBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppCompilerOutput));
    }
}